

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void google::protobuf::DynamicMessageFactory::DeleteDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_instance)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (0 < *(int *)(type + 0x38)) {
    lVar3 = 0;
    do {
      lVar1 = *(long *)(type + 0x40);
      if (0 < *(int *)(lVar1 + 0x1c + lVar3 * 0x30)) {
        lVar2 = 0;
        do {
          FieldDescriptor::type
                    (*(FieldDescriptor **)(*(long *)(lVar1 + 0x20 + lVar3 * 0x30) + lVar2 * 8));
          lVar2 = lVar2 + 1;
          lVar1 = *(long *)(type + 0x40);
        } while (lVar2 < *(int *)(lVar1 + 0x1c + lVar3 * 0x30));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(type + 0x38));
  }
  return;
}

Assistant:

void DynamicMessageFactory::DeleteDefaultOneofInstance(
    const Descriptor* type,
    const uint32 offsets[],
    const void* default_oneof_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
        switch (field->options().ctype()) {
          default:
          case FieldOptions::STRING:
            break;
        }
      }
    }
  }
}